

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O1

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  size_t *psVar1;
  uint *puVar2;
  char cVar3;
  uint uVar4;
  int *piVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  CURLofft CVar11;
  int iVar12;
  char *pcVar13;
  fileinfo *pfVar14;
  void *pvVar15;
  long lVar16;
  curlfiletype cVar17;
  size_t __n;
  fileinfo *pfVar18;
  byte bVar19;
  fileinfo *unaff_RBP;
  undefined7 uVar20;
  fileinfo *pfVar21;
  char *p;
  curl_off_t fsize;
  fileinfo *local_58;
  char *local_50;
  fileinfo *local_48;
  fileinfo *local_40;
  long local_38;
  
  pfVar21 = (fileinfo *)(size * nmemb);
  piVar5 = (int *)**(undefined8 **)((long)connptr + 0x1340);
  local_58 = pfVar21;
  if (piVar5[3] == 0) {
    if ((pfVar21 != (fileinfo *)0x0) && (*piVar5 == 0)) {
      *piVar5 = ((byte)(*buffer - 0x30U) < 10) + 1;
    }
    if (pfVar21 != (fileinfo *)0x0) {
      local_48 = (fileinfo *)((long)&(pfVar21->info).filename + 1);
      pfVar18 = (fileinfo *)0x0;
      do {
        cVar3 = buffer[(long)pfVar18];
        unaff_RBP = (fileinfo *)CONCAT71((int7)((ulong)unaff_RBP >> 8),cVar3);
        if (*(long *)(piVar5 + 4) == 0) {
          pfVar14 = Curl_fileinfo_alloc();
          *(fileinfo **)(piVar5 + 4) = pfVar14;
          if (pfVar14 != (fileinfo *)0x0) {
            pvVar15 = (*Curl_cmalloc)(0xa0);
            lVar16 = *(long *)(piVar5 + 4);
            *(void **)(lVar16 + 0x68) = pvVar15;
            if (pvVar15 != (void *)0x0) {
              *(undefined8 *)(lVar16 + 0x70) = 0xa0;
              piVar5[8] = 0;
              piVar5[9] = 0;
              piVar5[6] = 0;
              goto LAB_005ca892;
            }
          }
          piVar5[3] = 0x1b;
          iVar9 = 2;
          goto LAB_005cb4fb;
        }
LAB_005ca892:
        pfVar14 = *(fileinfo **)(piVar5 + 4);
        sVar6 = (pfVar14->info).b_used;
        (pfVar14->info).b_used = sVar6 + 1;
        (pfVar14->info).b_data[sVar6] = cVar3;
        sVar6 = (pfVar14->info).b_size;
        if (sVar6 - 1 <= (pfVar14->info).b_used) {
          local_40 = unaff_RBP;
          pcVar13 = (char *)(*Curl_crealloc)((pfVar14->info).b_data,sVar6 + 0xa0);
          if (pcVar13 == (char *)0x0) {
            Curl_fileinfo_cleanup(*(fileinfo **)(piVar5 + 4));
            piVar5[4] = 0;
            piVar5[5] = 0;
            piVar5[3] = 0x1b;
            iVar9 = 2;
            unaff_RBP = local_40;
            goto LAB_005cb4fb;
          }
          psVar1 = &(pfVar14->info).b_size;
          *psVar1 = *psVar1 + 0xa0;
          (pfVar14->info).b_data = pcVar13;
          unaff_RBP = local_40;
        }
        iVar9 = 2;
        bVar19 = (byte)unaff_RBP;
        uVar10 = (uint)unaff_RBP;
        if (*piVar5 == 2) {
          switch(piVar5[1]) {
          case 0:
            uVar10 = piVar5[6] + 1;
            piVar5[6] = uVar10;
            if (uVar10 < 9) {
              __n = 0xc;
              pcVar13 = "0123456789-";
LAB_005caee1:
              pvVar15 = memchr(pcVar13,(int)(char)bVar19,__n);
              if (pvVar15 == (void *)0x0) goto LAB_005caeef;
            }
            else {
              if ((uVar10 != 9) || (bVar19 != 0x20)) goto LAB_005caeef;
              piVar5[1] = 1;
              piVar5[2] = 0;
            }
            break;
          case 1:
            iVar12 = piVar5[6];
            piVar5[6] = iVar12 + 1U;
            if (piVar5[2] == 1) {
              if (bVar19 != 0x20) {
                __n = 0xf;
                pcVar13 = "APM0123456789:";
                goto LAB_005caee1;
              }
              *(long *)(piVar5 + 0x10) = *(long *)(piVar5 + 8);
              (pfVar14->info).b_data[((ulong)(iVar12 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
              piVar5[1] = 2;
              piVar5[2] = 0;
LAB_005cae2a:
              piVar5[6] = 0;
            }
            else if (((piVar5[2] == 0) && (bVar19 != 9)) && ((uVar10 & 0xff) != 0x20))
            goto LAB_005cab56;
            break;
          case 2:
            iVar12 = piVar5[2];
            if (iVar12 != 1) goto LAB_005cadd6;
            iVar9 = piVar5[6];
            piVar5[6] = iVar9 + 1U;
            if (bVar19 == 0x20) {
              (pfVar14->info).b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
              pcVar13 = (pfVar14->info).b_data + *(long *)(piVar5 + 8);
              iVar9 = strcmp("<DIR>",pcVar13);
              if (iVar9 == 0) {
                (pfVar14->info).filetype = CURLFILETYPE_DIRECTORY;
                (pfVar14->info).size = 0;
              }
              else {
                CVar11 = curlx_strtoofft(pcVar13,&local_50,10,&(pfVar14->info).size);
                if (CVar11 != CURL_OFFT_OK) {
                  piVar5[3] = 0x57;
                  iVar9 = 2;
                  goto LAB_005cb4fb;
                }
                *(undefined4 *)(*(long *)(piVar5 + 4) + 8) = 0;
              }
              *(uint *)(*(long *)(piVar5 + 4) + 0x60) =
                   *(uint *)(*(long *)(piVar5 + 4) + 0x60) | 0x40;
              piVar5[6] = 0;
              piVar5[1] = 3;
              piVar5[2] = 0;
            }
            break;
          case 3:
            iVar12 = piVar5[2];
            if (iVar12 == 2) {
              if (bVar19 != 10) goto LAB_005caeef;
              *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
            }
            else {
              if (iVar12 != 1) goto LAB_005cadd6;
              piVar5[6] = piVar5[6] + 1;
              if (bVar19 != 10) {
                if ((uVar10 & 0xff) == 0xd) {
                  piVar5[2] = 2;
                  (pfVar14->info).b_data[(pfVar14->info).b_used - 1] = '\0';
                }
                break;
              }
              *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
              (pfVar14->info).b_data[(pfVar14->info).b_used - 1] = '\0';
            }
            ftp_pl_insert_finfo((Curl_easy *)connptr,pfVar14);
            piVar5[1] = 0;
            piVar5[2] = 0;
          }
          goto switchD_005ca9c1_default;
        }
        if (*piVar5 != 1) {
          local_58 = local_48;
          goto LAB_005cb4fb;
        }
        uVar20 = (undefined7)((ulong)unaff_RBP >> 8);
        switch(piVar5[1]) {
        case 0:
          if (piVar5[2] == 1) {
            uVar4 = piVar5[6];
            piVar5[6] = uVar4 + 1;
            if (bVar19 == 10) {
              (pfVar14->info).b_data[uVar4] = '\0';
              pcVar13 = (pfVar14->info).b_data;
              iVar12 = strncmp("total ",pcVar13,6);
              unaff_RBP = pfVar14;
              if (iVar12 == 0) {
                for (pcVar13 = pcVar13 + 6; (*pcVar13 == '\t' || (*pcVar13 == ' '));
                    pcVar13 = pcVar13 + 1) {
                }
                do {
                  cVar3 = *pcVar13;
                  pcVar13 = pcVar13 + 1;
                } while ((byte)(cVar3 - 0x30U) < 10);
                if (cVar3 == '\0') {
                  piVar5[1] = 1;
                  (pfVar14->info).b_used = 0;
                  break;
                }
                piVar5[3] = 0x57;
                iVar9 = 2;
              }
              else {
                piVar5[3] = 0x57;
              }
              goto LAB_005cb4fb;
            }
            if ((uVar10 & 0xff) == 0xd) {
              piVar5[6] = uVar4;
              psVar1 = &(pfVar14->info).b_used;
              *psVar1 = *psVar1 - 1;
            }
          }
          else if (piVar5[2] == 0) {
            if (bVar19 != 0x74) {
              piVar5[1] = 1;
              (pfVar14->info).b_used = 0;
              iVar9 = 3;
              goto LAB_005cb4fb;
            }
            piVar5[2] = 1;
            piVar5[6] = piVar5[6] + 1;
          }
          break;
        case 1:
          uVar10 = uVar10 & 0xff;
          if (uVar10 < 100) {
            if (uVar10 < 0x62) {
              cVar17 = CURLFILETYPE_FILE;
              if (uVar10 != 0x2d) {
                if (uVar10 != 0x44) goto LAB_005caeef;
                cVar17 = CURLFILETYPE_DOOR;
              }
            }
            else if (uVar10 == 0x62) {
              cVar17 = CURLFILETYPE_DEVICE_BLOCK;
            }
            else {
              if (uVar10 != 99) goto LAB_005caeef;
              cVar17 = CURLFILETYPE_DEVICE_CHAR;
            }
          }
          else if (uVar10 < 0x70) {
            if (uVar10 == 100) {
              cVar17 = CURLFILETYPE_DIRECTORY;
            }
            else {
              if (uVar10 != 0x6c) goto LAB_005caeef;
              cVar17 = CURLFILETYPE_SYMLINK;
            }
          }
          else if (uVar10 == 0x70) {
            cVar17 = CURLFILETYPE_NAMEDPIPE;
          }
          else {
            if (uVar10 != 0x73) goto LAB_005caeef;
            cVar17 = CURLFILETYPE_SOCKET;
          }
          (pfVar14->info).filetype = cVar17;
          piVar5[1] = 2;
          piVar5[6] = 0;
          piVar5[8] = 1;
          piVar5[9] = 0;
          break;
        case 2:
          uVar10 = piVar5[6] + 1;
          piVar5[6] = uVar10;
          if (uVar10 < 10) {
            __n = 9;
            pcVar13 = "rwx-tTsS";
            goto LAB_005caee1;
          }
          if (uVar10 == 10) {
            if (bVar19 == 0x20) {
              (pfVar14->info).b_data[10] = '\0';
              lVar16 = *(long *)(piVar5 + 8);
              uVar10 = ftp_pl_get_permission((pfVar14->info).b_data + lVar16);
              if (0xffffff < uVar10) {
                piVar5[3] = 0x57;
                iVar9 = 2;
              }
              else {
                lVar7 = *(long *)(piVar5 + 4);
                puVar2 = (uint *)(lVar7 + 0x60);
                *puVar2 = *puVar2 | 8;
                *(uint *)(lVar7 + 0x18) = uVar10;
                *(long *)(piVar5 + 0x12) = lVar16;
                piVar5[6] = 0;
                piVar5[1] = 3;
                piVar5[2] = 0;
                iVar9 = 0;
              }
              bVar8 = 0xffffff >= uVar10;
              unaff_RBP = pfVar18;
            }
            else {
              piVar5[3] = 0x57;
              bVar8 = false;
              iVar9 = 2;
            }
            if (!bVar8) goto LAB_005cb4fb;
          }
          break;
        case 3:
          iVar12 = piVar5[2];
          if (iVar12 == 1) {
            iVar12 = piVar5[6];
            piVar5[6] = iVar12 + 1U;
            if (bVar19 == 0x20) {
              (pfVar14->info).b_data[((ulong)(iVar12 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
              lVar16 = strtol((pfVar14->info).b_data + *(long *)(piVar5 + 8),&local_50,10);
              if ((*local_50 == '\0') && (lVar16 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
                lVar7 = *(long *)(piVar5 + 4);
                puVar2 = (uint *)(lVar7 + 0x60);
                *puVar2 = *puVar2 | 0x80;
                *(long *)(lVar7 + 0x30) = lVar16;
              }
              piVar5[6] = 0;
              piVar5[8] = 0;
              piVar5[9] = 0;
              piVar5[1] = 4;
              piVar5[2] = 0;
            }
            else {
              unaff_RBP = (fileinfo *)CONCAT71(uVar20,bVar19 - 0x3a);
              if ((byte)(bVar19 - 0x3a) < 0xf6) goto LAB_005caeef;
            }
          }
          else {
LAB_005cad9f:
            if ((iVar12 == 0) && (bVar19 != 0x20)) {
              unaff_RBP = (fileinfo *)CONCAT71(uVar20,bVar19 - 0x30);
              if ((byte)(bVar19 - 0x30) < 10) goto LAB_005cade8;
              goto LAB_005caeef;
            }
          }
          break;
        case 4:
          iVar12 = piVar5[2];
          if (iVar12 == 1) {
            iVar9 = piVar5[6];
            piVar5[6] = iVar9 + 1U;
            if (bVar19 == 0x20) {
              (pfVar14->info).b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
              *(undefined8 *)(piVar5 + 0xc) = *(undefined8 *)(piVar5 + 8);
              piVar5[1] = 5;
              piVar5[2] = 0;
LAB_005cad85:
              piVar5[8] = 0;
              piVar5[9] = 0;
              goto LAB_005cae2a;
            }
          }
          else {
LAB_005cadd6:
            if (iVar12 == 0) goto switchD_005cabe4_caseD_0;
          }
          break;
        case 5:
          iVar12 = piVar5[2];
          if (iVar12 != 1) goto LAB_005cadd6;
          iVar9 = piVar5[6];
          piVar5[6] = iVar9 + 1U;
          if (bVar19 == 0x20) {
            (pfVar14->info).b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
            *(undefined8 *)(piVar5 + 0xe) = *(undefined8 *)(piVar5 + 8);
            piVar5[1] = 6;
            piVar5[2] = 0;
            goto LAB_005cad85;
          }
          break;
        case 6:
          iVar12 = piVar5[2];
          if (iVar12 != 1) goto LAB_005cad9f;
          iVar12 = piVar5[6];
          piVar5[6] = iVar12 + 1U;
          if (bVar19 == 0x20) {
            (pfVar14->info).b_data[((ulong)(iVar12 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
            CVar11 = curlx_strtoofft((pfVar14->info).b_data + *(long *)(piVar5 + 8),&local_50,10,
                                     &local_38);
            if (CVar11 == CURL_OFFT_OK) {
              if (local_38 + 0x7fffffffffffffffU < 0xfffffffffffffffe && *local_50 == '\0') {
                lVar16 = *(long *)(piVar5 + 4);
                puVar2 = (uint *)(lVar16 + 0x60);
                *puVar2 = *puVar2 | 0x40;
                *(long *)(lVar16 + 0x28) = local_38;
              }
              piVar5[6] = 0;
              piVar5[8] = 0;
              piVar5[9] = 0;
              piVar5[1] = 7;
              piVar5[2] = 0;
            }
          }
          else {
            unaff_RBP = (fileinfo *)CONCAT71(uVar20,bVar19 - 0x30);
            if (9 < (byte)(bVar19 - 0x30)) goto LAB_005caeef;
          }
          break;
        case 7:
          switch(piVar5[2]) {
          case 0:
            if (bVar19 != 0x20) {
              if ((9 < (byte)(bVar19 - 0x30)) &&
                 (bVar19 = (char)((ulong)unaff_RBP & 0xffffffffffffffdf) + 0xbf,
                 unaff_RBP = (fileinfo *)
                             CONCAT71((int7)(((ulong)unaff_RBP & 0xffffffffffffffdf) >> 8),bVar19),
                 0x19 < bVar19)) goto LAB_005caeef;
              goto LAB_005cade8;
            }
            break;
          case 1:
            piVar5[6] = piVar5[6] + 1;
            if (bVar19 == 0x20) {
LAB_005cb132:
              piVar5[2] = 2;
            }
            else {
LAB_005cb13f:
              if ((0x19 < (byte)(bVar19 + 0x9f) && 9 < (byte)(bVar19 - 0x30)) &&
                 (bVar19 != 0x2e && (byte)(bVar19 + 0xa5) < 0xe6)) goto LAB_005caeef;
            }
            break;
          case 2:
            piVar5[6] = piVar5[6] + 1;
            if (bVar19 != 0x20) {
              if ((9 < (byte)(bVar19 - 0x30)) &&
                 (bVar19 = (char)((ulong)unaff_RBP & 0xffffffffffffffdf) + 0xbf,
                 unaff_RBP = (fileinfo *)
                             CONCAT71((int7)(((ulong)unaff_RBP & 0xffffffffffffffdf) >> 8),bVar19),
                 0x19 < bVar19)) goto LAB_005caeef;
LAB_005cb264:
              piVar5[2] = 3;
            }
            break;
          case 3:
            piVar5[6] = piVar5[6] + 1;
            if (bVar19 != 0x20) goto LAB_005cb13f;
LAB_005cb295:
            piVar5[2] = 4;
            break;
          case 4:
            piVar5[6] = piVar5[6] + 1;
            if (bVar19 != 0x20) {
              if ((9 < (byte)(bVar19 - 0x30)) &&
                 (bVar19 = (char)((ulong)unaff_RBP & 0xffffffffffffffdf) + 0xbf,
                 unaff_RBP = (fileinfo *)
                             CONCAT71((int7)(((ulong)unaff_RBP & 0xffffffffffffffdf) >> 8),bVar19),
                 0x19 < bVar19)) goto LAB_005caeef;
              piVar5[2] = 5;
            }
            break;
          case 5:
            iVar12 = piVar5[6];
            piVar5[6] = iVar12 + 1U;
            if (bVar19 == 0x20) {
              (pfVar14->info).b_data[((ulong)(iVar12 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
              *(undefined8 *)(piVar5 + 0x10) = *(undefined8 *)(piVar5 + 8);
              if ((pfVar14->info).filetype == CURLFILETYPE_SYMLINK) {
                piVar5[1] = 9;
                piVar5[2] = 0;
              }
              else {
                piVar5[1] = 8;
                piVar5[2] = 0;
              }
            }
            else if (((((byte)(bVar19 - 0x3a) < 0xf6) && ((byte)((bVar19 & 0xdf) + 0xa5) < 0xe6)) &&
                     (bVar19 != 0x2e)) && ((uVar10 & 0xff) != 0x3a)) goto LAB_005caeef;
          }
          break;
        case 8:
          iVar12 = piVar5[2];
          if (iVar12 == 2) {
            if (bVar19 != 10) goto LAB_005caeef;
            (pfVar14->info).b_data[((ulong)(uint)piVar5[6] - 1) + *(long *)(piVar5 + 8)] = '\0';
          }
          else {
            if (iVar12 != 1) goto LAB_005cadd6;
            iVar9 = piVar5[6];
            piVar5[6] = iVar9 + 1U;
            if (bVar19 != 10) {
              if ((uVar10 & 0xff) == 0xd) goto LAB_005cb132;
              break;
            }
            (pfVar14->info).b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
          }
          *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
          piVar5[1] = 1;
          ftp_pl_insert_finfo((Curl_easy *)connptr,pfVar14);
          break;
        case 9:
          switch(piVar5[2]) {
          case 0:
switchD_005cabe4_caseD_0:
            if (bVar19 != 0x20) {
LAB_005cade8:
              *(size_t *)(piVar5 + 8) = (pfVar14->info).b_used - 1;
              piVar5[6] = 1;
              piVar5[2] = 1;
            }
            break;
          case 1:
            piVar5[6] = piVar5[6] + 1;
            if ((bVar19 == 10) || ((uVar10 & 0xff) == 0xd)) goto LAB_005caeef;
            if ((uVar10 & 0xff) == 0x20) goto LAB_005cb132;
            break;
          case 2:
            piVar5[6] = piVar5[6] + 1;
            if ((bVar19 == 10) || ((uVar10 & 0xff) == 0xd)) goto LAB_005caeef;
            if ((uVar10 & 0xff) == 0x2d) goto LAB_005cb264;
LAB_005cab56:
            piVar5[2] = 1;
            break;
          case 3:
            piVar5[6] = piVar5[6] + 1;
            if ((bVar19 != 10) && ((uVar10 & 0xff) != 0xd)) {
              if ((uVar10 & 0xff) == 0x3e) goto LAB_005cb295;
              goto LAB_005cab56;
            }
            goto LAB_005caeef;
          case 4:
            iVar12 = piVar5[6];
            piVar5[6] = iVar12 + 1U;
            if ((bVar19 == 10) || ((uVar10 & 0xff) == 0xd)) goto LAB_005caeef;
            if ((uVar10 & 0xff) != 0x20) goto LAB_005cab56;
            piVar5[2] = 5;
            (pfVar14->info).b_data[((ulong)(iVar12 + 1U) - 4) + *(long *)(piVar5 + 8)] = '\0';
            *(undefined8 *)(piVar5 + 10) = *(undefined8 *)(piVar5 + 8);
            piVar5[6] = 0;
            piVar5[8] = 0;
            piVar5[9] = 0;
            break;
          case 5:
            if ((bVar19 == 10) || ((uVar10 & 0xff) == 0xd)) goto LAB_005caeef;
            piVar5[2] = 6;
            *(size_t *)(piVar5 + 8) = (pfVar14->info).b_used - 1;
            piVar5[6] = 1;
            break;
          case 6:
            iVar9 = piVar5[6];
            piVar5[6] = iVar9 + 1U;
            if (bVar19 == 10) {
              (pfVar14->info).b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar5 + 8)] = '\0';
LAB_005cb4ae:
              *(undefined8 *)(piVar5 + 0x14) = *(undefined8 *)(piVar5 + 8);
              ftp_pl_insert_finfo((Curl_easy *)connptr,pfVar14);
              piVar5[1] = 1;
            }
            else if ((uVar10 & 0xff) == 0xd) {
              piVar5[2] = 7;
            }
            break;
          case 7:
            if (bVar19 == 10) {
              (pfVar14->info).b_data[((ulong)(uint)piVar5[6] - 1) + *(long *)(piVar5 + 8)] = '\0';
              goto LAB_005cb4ae;
            }
LAB_005caeef:
            piVar5[3] = 0x57;
            goto LAB_005cb4fb;
          }
        }
switchD_005ca9c1_default:
        pfVar18 = (fileinfo *)((long)&(pfVar18->info).filename + 1);
        iVar9 = 0;
LAB_005cb4fb:
        if ((iVar9 != 0) && (iVar9 != 3)) {
          if (iVar9 != 2) {
            return (size_t)local_58;
          }
          goto LAB_005ca82c;
        }
      } while (pfVar18 < pfVar21);
    }
  }
  else {
LAB_005ca82c:
    if (*(fileinfo **)(piVar5 + 4) != (fileinfo *)0x0) {
      Curl_fileinfo_cleanup(*(fileinfo **)(piVar5 + 4));
      piVar5[4] = 0;
      piVar5[5] = 0;
    }
  }
  return (size_t)local_58;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct Curl_easy *data = (struct Curl_easy *)connptr;
  struct ftp_wc *ftpwc = data->wildcard.protdata;
  struct ftp_parselist_data *parser = ftpwc->parser;
  struct fileinfo *infop;
  struct curl_fileinfo *finfo;
  unsigned long i = 0;
  CURLcode result;
  size_t retsize = bufflen;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is hadled later
     *    in wc_statemach()
     */
    goto fail;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = (buffer[0] >= '0' && buffer[0] <= '9') ?
                       OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */

    char c = buffer[i];
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->file_data->info.b_data = malloc(FTP_BUFFER_ALLOCSIZE);
      if(!parser->file_data->info.b_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->file_data->info.b_size = FTP_BUFFER_ALLOCSIZE;
      parser->item_offset = 0;
      parser->item_length = 0;
    }

    infop = parser->file_data;
    finfo = &infop->info;
    finfo->b_data[finfo->b_used++] = c;

    if(finfo->b_used >= finfo->b_size - 1) {
      /* if it is important, extend buffer space for file data */
      char *tmp = realloc(finfo->b_data,
                          finfo->b_size + FTP_BUFFER_ALLOCSIZE);
      if(tmp) {
        finfo->b_size += FTP_BUFFER_ALLOCSIZE;
        finfo->b_data = tmp;
      }
      else {
        Curl_fileinfo_cleanup(parser->file_data);
        parser->file_data = NULL;
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
    }

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            finfo->b_used = 0;
            continue;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            finfo->b_used--;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_length - 1] = 0;
            if(strncmp("total ", finfo->b_data, 6) == 0) {
              char *endptr = finfo->b_data + 6;
              /* here we can deal with directory size, pass the leading
                 whitespace and then the digits */
              while(ISBLANK(*endptr))
                endptr++;
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              finfo->b_used = 0;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          finfo->b_data[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(finfo->b_data + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(finfo->b_data + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(c < '0' || c > '9') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(!curlx_strtoofft(finfo->b_data + parser->item_offset,
                                &p, 10, &fsize)) {
              if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                 fsize != CURL_OFF_T_MIN) {
                parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
                parser->file_data->info.size = fsize;
              }
              parser->item_length = 0;
              parser->item_offset = 0;
              parser->state.UNIX.main = PL_UNIX_TIME;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
            }
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = finfo->b_used -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->b_data + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            finfo->b_data[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else {
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISBLANK(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", finfo->b_data + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              if(curlx_strtoofft(finfo->b_data +
                                 parser->item_offset,
                                 &endptr, 10, &finfo->size)) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            finfo->b_data[finfo->b_used - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            finfo->b_data[finfo->b_used - 1] = 0;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    default:
      retsize = bufflen + 1;
      goto fail;
    }

    i++;
  }
  return retsize;

fail:

  /* Clean up any allocated memory. */
  if(parser->file_data) {
    Curl_fileinfo_cleanup(parser->file_data);
    parser->file_data = NULL;
  }

  return retsize;
}